

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::setVolumeDensity(btSoftBody *this,btScalar density)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  lVar1 = (long)(this->m_tetras).m_size;
  if (lVar1 < 1) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = 0.0;
    lVar2 = 0;
    do {
      fVar4 = ABS(*(float *)((long)(((this->m_tetras).m_data)->m_c0 + -1) + lVar2));
      fVar3 = fVar3 + fVar4 + fVar4 + fVar4 + fVar4;
      lVar2 = lVar2 + 0x88;
    } while (lVar1 * 0x88 != lVar2);
  }
  setVolumeMass(this,(fVar3 * density) / 6.0);
  return;
}

Assistant:

void			btSoftBody::setVolumeDensity(btScalar density)
{
btScalar	volume=0;
for(int i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		volume+=btFabs(t.m_rv);
		}
	}
setVolumeMass(volume*density/6);
}